

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sptr_t file_read(char *path,char *mode)

{
  sptr_t sVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  FILE *__stream_00;
  uchar *size;
  char *__ptr;
  uchar *puVar4;
  size_t total;
  uchar *data;
  size_t fsize;
  FILE *f;
  char *mode_local;
  char *path_local;
  sptr_t result;
  
  memset(&path_local,0,0x10);
  if ((path != (char *)0x0) && (mode != (char *)0x0)) {
    __stream_00 = fopen(path,mode);
    if (__stream_00 == (FILE *)0x0) {
      perror("Unable to open file for reading\n");
      fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
    }
    else {
      fseek(__stream_00,0,2);
      size = (uchar *)ftell(__stream_00);
      fseek(__stream_00,0,0);
      __ptr = (char *)xmalloc((size_t)size);
      puVar4 = (uchar *)fread(__ptr,1,(size_t)size,__stream_00);
      if (puVar4 == (uchar *)0x0) {
        perror("Unable to read file\n");
        fprintf(_stderr,"File: \"%s\", mode \"%s\"\n",path,mode);
        iVar2 = ferror(__stream_00);
        __stream = _stderr;
        if (iVar2 == 0) {
          iVar2 = feof(__stream_00);
          if (iVar2 != 0) {
            fprintf(_stderr,"Unexpected EOF\n");
          }
        }
        else {
          uVar3 = ferror(__stream_00);
          fprintf(__stream,"IO error %d\n",(ulong)uVar3);
        }
        free(__ptr);
      }
      else {
        path_local = __ptr;
        result.ptr = puVar4;
        if (size != puVar4) {
          fprintf(_stderr,"Warning: only %lld of %lld bytes read from \"%s\"\n",puVar4,size,path);
        }
      }
      fclose(__stream_00);
    }
  }
  sVar1.size = (size_t)result.ptr;
  sVar1.ptr = (uchar *)path_local;
  return sVar1;
}

Assistant:

sptr_t file_read(const char *path, const char *mode)
{
	sptr_t result = SPTR_NULL;
	if (path == NULL || mode == NULL) {
		return result;
	}
	FILE *f = fopen(path, mode);
	if (!f) {
		perror("Unable to open file for reading\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		return result;
	}
	fseek(f, 0, SEEK_END);
	size_t fsize = ftell(f);
	fseek(f, 0, SEEK_SET);

	unsigned char *data = xmalloc(fsize);
	size_t total = fread(data, 1, fsize, f);
	if (total) {
		result.ptr = data;
		result.size = total;
		if (fsize != total) {
			fprintf(stderr, "Warning: only %lld of %lld bytes read from \"%s\"\n", total, fsize, path);
		}
	} else {
		perror("Unable to read file\n");
		fprintf(stderr, "File: \"%s\", mode \"%s\"\n", path, mode);
		if (ferror(f)) {
			fprintf(stderr, "IO error %d\n", ferror(f));
		} else if (feof(f)) {
			fprintf(stderr, "Unexpected EOF\n");
		}
		free(data);
		total = 0;
		data = NULL;
		goto end;
	}
end:
	fclose(f);
	return result;
}